

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O1

double __thiscall ON_Quaternion::Length(ON_Quaternion *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = ABS(this->a);
  dVar4 = ABS(this->b);
  dVar3 = ABS(this->c);
  dVar1 = ABS(this->d);
  if (((((dVar6 <= dVar4) && (dVar3 <= dVar4)) &&
       (dVar2 = dVar3, dVar5 = dVar6, dVar7 = dVar4, dVar1 <= dVar4)) ||
      ((((dVar5 = dVar4, dVar6 <= dVar3 && (dVar4 <= dVar3)) &&
        (dVar2 = dVar6, dVar7 = dVar3, dVar1 <= dVar3)) ||
       ((dVar2 = dVar3, dVar7 = dVar6, dVar1 < dVar6 || (dVar1 < dVar4)))))) || (dVar1 < dVar3)) {
    dVar3 = dVar2;
    dVar4 = dVar5;
    dVar6 = dVar1;
    dVar1 = dVar7;
  }
  if (dVar1 <= 2.2250738585072014e-308) {
    if (dVar1 <= 0.0) {
      dVar1 = 0.0;
    }
  }
  else {
    dVar2 = 1.0 / dVar1;
    dVar3 = dVar2 * dVar6 * dVar2 * dVar6 +
            dVar3 * dVar2 * dVar3 * dVar2 + dVar4 * dVar2 * dVar4 * dVar2 + 1.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar1 = dVar1 * dVar3;
  }
  return dVar1;
}

Assistant:

double ON_Quaternion::Length() const
{
  double len;
  double fa = fabs(a);
  double fb = fabs(b);
  double fc = fabs(c);
  double fd = fabs(d);
  if ( fb >= fa && fb >= fc && fb >= fd) 
  {
    len = fa; fa = fb; fb = len;
  }
  else if ( fc >= fa && fc >= fb && fc >= fd) 
  {
    len = fa; fa = fc; fc = len;
  }
  else if ( fd >= fa && fd >= fb && fd >= fc) 
  {
    len = fa; fa = fd; fd = len;
  }

  // 15 September 2003 Dale Lear
  //     For small denormalized doubles (positive but smaller
  //     than DBL_MIN), some compilers/FPUs set 1.0/fa to +INF.
  //     Without the ON_DBL_MIN test we end up with
  //     microscopic quaternions that have infinite norm!
  //
  //     This code is absolutely necessary.  It is a critical
  //     part of the bug fix for RR 11217.
  if ( fa > ON_DBL_MIN ) 
  {
    len = 1.0/fa;
    fb *= len;
    fc *= len;
    fd *= len;
    len = fa*sqrt(1.0 + fb*fb + fc*fc + fd*fd);
  }
  else if ( fa > 0.0 && ON_IS_FINITE(fa) )
    len = fa;
  else
    len = 0.0;

  return len;
}